

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall
pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>::ParamArray
          (ParamArray<pbrt::syntactic::Texture> *this,string *type)

{
  string *in_RSI;
  undefined8 *in_RDI;
  Param *in_stack_ffffffffffffffe0;
  
  Param::Param(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR_getType_abi_cxx11__0021ae18;
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RSI);
  std::shared_ptr<pbrt::syntactic::Texture>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Texture> *)0x183e57);
  return;
}

Assistant:

virtual std::string getType() const { return type; }